

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelCreationUtils.cpp
# Opt level: O1

Pipeline *
buildEmptyPipelineModelWithStringOutput
          (Model *m,bool isUpdatable,TensorAttributes *inTensorAttr,char *outTensorName)

{
  RepeatedField<long> *this;
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  Rep *pRVar4;
  ModelDescription *pMVar5;
  FeatureType *pFVar6;
  ArrayFeatureType *pAVar7;
  long *plVar8;
  FeatureDescription *pFVar9;
  void *pvVar10;
  StringFeatureType *pSVar11;
  Pipeline *pPVar12;
  undefined8 *puVar13;
  int iVar14;
  Arena *pAVar15;
  
  if (m->description_ == (ModelDescription *)0x0) {
    uVar3 = (m->super_MessageLite)._internal_metadata_.ptr_;
    pAVar15 = (Arena *)(uVar3 & 0xfffffffffffffffc);
    if ((uVar3 & 1) != 0) {
      pAVar15 = *(Arena **)pAVar15;
    }
    pMVar5 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                       (pAVar15);
    m->description_ = pMVar5;
  }
  pMVar5 = m->description_;
  pRVar4 = (pMVar5->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_002030b7:
    pFVar9 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                       ((pMVar5->input_).super_RepeatedPtrFieldBase.arena_);
    pvVar10 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pMVar5->input_).super_RepeatedPtrFieldBase,pFVar9);
  }
  else {
    iVar14 = (pMVar5->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar14) goto LAB_002030b7;
    (pMVar5->input_).super_RepeatedPtrFieldBase.current_size_ = iVar14 + 1;
    pvVar10 = pRVar4->elements[iVar14];
  }
  puVar13 = (undefined8 *)(*(ulong *)((long)pvVar10 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar10 + 8) & 1) != 0) {
    puVar13 = (undefined8 *)*puVar13;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar10 + 0x10),inTensorAttr->name,puVar13);
  if (*(long *)((long)pvVar10 + 0x20) == 0) {
    pAVar15 = (Arena *)(*(ulong *)((long)pvVar10 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar10 + 8) & 1) != 0) {
      pAVar15 = *(Arena **)pAVar15;
    }
    pFVar6 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar15);
    *(FeatureType **)((long)pvVar10 + 0x20) = pFVar6;
  }
  pFVar6 = *(FeatureType **)((long)pvVar10 + 0x20);
  if (pFVar6->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar6);
    pFVar6->_oneof_case_[0] = 5;
    uVar3 = (pFVar6->super_MessageLite)._internal_metadata_.ptr_;
    pAVar15 = (Arena *)(uVar3 & 0xfffffffffffffffc);
    if ((uVar3 & 1) != 0) {
      pAVar15 = *(Arena **)pAVar15;
    }
    pAVar7 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar15);
    (pFVar6->Type_).multiarraytype_ = pAVar7;
  }
  pAVar7 = (pFVar6->Type_).multiarraytype_;
  pAVar7->datatype_ = 0x10020;
  if (0 < inTensorAttr->dimension) {
    this = &pAVar7->shape_;
    iVar14 = 0;
    do {
      uVar1 = (pAVar7->shape_).current_size_;
      uVar2 = (pAVar7->shape_).total_size_;
      if (uVar1 == uVar2) {
        google::protobuf::RepeatedField<long>::Reserve(this,uVar2 + 1);
      }
      plVar8 = google::protobuf::RepeatedField<long>::elements(this);
      plVar8[uVar1] = 1;
      this->current_size_ = uVar1 + 1;
      iVar14 = iVar14 + 1;
    } while (iVar14 < inTensorAttr->dimension);
  }
  if (m->description_ == (ModelDescription *)0x0) {
    uVar3 = (m->super_MessageLite)._internal_metadata_.ptr_;
    pAVar15 = (Arena *)(uVar3 & 0xfffffffffffffffc);
    if ((uVar3 & 1) != 0) {
      pAVar15 = *(Arena **)pAVar15;
    }
    pMVar5 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                       (pAVar15);
    m->description_ = pMVar5;
  }
  pMVar5 = m->description_;
  pRVar4 = (pMVar5->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 != (Rep *)0x0) {
    iVar14 = (pMVar5->output_).super_RepeatedPtrFieldBase.current_size_;
    if (iVar14 < pRVar4->allocated_size) {
      (pMVar5->output_).super_RepeatedPtrFieldBase.current_size_ = iVar14 + 1;
      pvVar10 = pRVar4->elements[iVar14];
      goto LAB_00203206;
    }
  }
  pFVar9 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                     ((pMVar5->output_).super_RepeatedPtrFieldBase.arena_);
  pvVar10 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                      (&(pMVar5->output_).super_RepeatedPtrFieldBase,pFVar9);
LAB_00203206:
  puVar13 = (undefined8 *)(*(ulong *)((long)pvVar10 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar10 + 8) & 1) != 0) {
    puVar13 = (undefined8 *)*puVar13;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar10 + 0x10),outTensorName,puVar13);
  if (*(long *)((long)pvVar10 + 0x20) == 0) {
    pAVar15 = (Arena *)(*(ulong *)((long)pvVar10 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar10 + 8) & 1) != 0) {
      pAVar15 = *(Arena **)pAVar15;
    }
    pFVar6 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar15);
    *(FeatureType **)((long)pvVar10 + 0x20) = pFVar6;
  }
  pFVar6 = *(FeatureType **)((long)pvVar10 + 0x20);
  if (pFVar6->_oneof_case_[0] != 3) {
    CoreML::Specification::FeatureType::clear_Type(pFVar6);
    pFVar6->_oneof_case_[0] = 3;
    uVar3 = (pFVar6->super_MessageLite)._internal_metadata_.ptr_;
    pAVar15 = (Arena *)(uVar3 & 0xfffffffffffffffc);
    if ((uVar3 & 1) != 0) {
      pAVar15 = *(Arena **)pAVar15;
    }
    pSVar11 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::StringFeatureType>
                        (pAVar15);
    (pFVar6->Type_).stringtype_ = pSVar11;
  }
  m->specificationversion_ = 4;
  if (m->_oneof_case_[0] != 0xca) {
    CoreML::Specification::Model::clear_Type(m);
    m->_oneof_case_[0] = 0xca;
    uVar3 = (m->super_MessageLite)._internal_metadata_.ptr_;
    pAVar15 = (Arena *)(uVar3 & 0xfffffffffffffffc);
    if ((uVar3 & 1) != 0) {
      pAVar15 = *(Arena **)pAVar15;
    }
    pPVar12 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::Pipeline>(pAVar15);
    (m->Type_).pipeline_ = pPVar12;
  }
  if (isUpdatable) {
    m->isupdatable_ = true;
  }
  return (Pipeline *)(m->Type_).pipelineclassifier_;
}

Assistant:

Specification::Pipeline* buildEmptyPipelineModelWithStringOutput(Specification::Model& m, bool isUpdatable, const TensorAttributes *inTensorAttr, const char *outTensorName) {
    auto inTensor = m.mutable_description()->add_input();
    inTensor->set_name(inTensorAttr->name);
    auto inTensorShape = inTensor->mutable_type()->mutable_multiarraytype();
    inTensorShape->set_datatype(Specification::ArrayFeatureType_ArrayDataType_FLOAT32);
    for (int i = 0; i < inTensorAttr->dimension; i++) {
        inTensorShape->add_shape(1);
    }
    
    auto outTensor = m.mutable_description()->add_output();
    outTensor->set_name(outTensorName);
    outTensor->mutable_type()->mutable_stringtype();
    
    m.set_specificationversion(MLMODEL_SPECIFICATION_VERSION_IOS13);
    
    auto pipeline = m.mutable_pipeline();
    
    if (isUpdatable) {
        m.set_isupdatable(true);
    }
    
    return pipeline;
}